

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

State * __thiscall re2::DFA::CachedState(DFA *this,int *inst,int ninst,uint flag)

{
  StateSet *this_00;
  ulong uVar1;
  int iVar2;
  iterator iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  __hashtable *__h;
  State *s;
  __node_gen_type __node_gen;
  State state;
  State *local_58;
  size_t local_50;
  _Hashtable<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_48;
  int *local_40;
  int local_38;
  uint local_34;
  
  local_48 = (_Hashtable<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)&local_40;
  this_00 = &this->state_cache_;
  local_40 = inst;
  local_38 = ninst;
  local_34 = flag;
  iVar3 = std::
          _Hashtable<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&this_00->_M_h,(key_type *)&local_48);
  if (iVar3.super__Node_iterator_base<re2::DFA::State_*,_true>._M_cur == (__node_type *)0x0) {
    iVar2 = this->prog_->bytemap_range_;
    uVar1 = (long)iVar2 + 1;
    lVar4 = ((long)ninst << 0x22) + (uVar1 << 0x23);
    lVar7 = lVar4 + 0x3000000000 >> 0x20;
    if (this->mem_budget_ < lVar7) {
      this->mem_budget_ = -1;
      local_58 = (State *)0x0;
    }
    else {
      local_50 = (long)ninst << 2;
      this->mem_budget_ = this->mem_budget_ - lVar7;
      uVar5 = lVar4 + 0x1000000000 >> 0x20;
      uVar6 = 0xffffffffffffffff;
      if (-1 < (long)uVar5) {
        uVar6 = uVar5;
      }
      local_58 = (State *)operator_new__(uVar6);
      if (-1 < iVar2) {
        uVar6 = 0;
        do {
          (&local_58[1].inst_)[uVar6] = (int *)0x0;
          uVar6 = uVar6 + 1;
        } while ((uVar1 & 0xffffffff) != uVar6);
      }
      local_58->inst_ = &local_58[1].ninst_ + (long)iVar2 * 2;
      memmove(local_58->inst_,inst,local_50);
      local_58->ninst_ = ninst;
      local_58->flag_ = flag;
      local_48 = &this_00->_M_h;
      std::
      _Hashtable<re2::DFA::State*,re2::DFA::State*,std::allocator<re2::DFA::State*>,std::__detail::_Identity,re2::DFA::StateEqual,re2::DFA::StateHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<re2::DFA::State*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<re2::DFA::State*,true>>>>
                ((_Hashtable<re2::DFA::State*,re2::DFA::State*,std::allocator<re2::DFA::State*>,std::__detail::_Identity,re2::DFA::StateEqual,re2::DFA::StateHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)this_00,&local_58);
    }
  }
  else {
    local_58 = *(State **)
                ((long)iVar3.super__Node_iterator_base<re2::DFA::State_*,_true>._M_cur + 8);
  }
  return local_58;
}

Assistant:

DFA::State* DFA::CachedState(int* inst, int ninst, uint flag) {
  if (DEBUG_MODE)
    mutex_.AssertHeld();

  // Look in the cache for a pre-existing state.
  State state = {inst, ninst, flag};
  StateSet::iterator it = state_cache_.find(&state);
  if (it != state_cache_.end()) {
    if (DebugDFA)
      fprintf(stderr, " -cached-> %s\n", DumpState(*it).c_str());
    return *it;
  }

  // Must have enough memory for new state.
  // In addition to what we're going to allocate,
  // the state cache hash table seems to incur about 32 bytes per
  // State*, empirically.
  const int kStateCacheOverhead = 32;
  int nnext = prog_->bytemap_range() + 1;  // + 1 for kByteEndText slot
  int mem = sizeof(State) + nnext*sizeof(std::atomic<State*>) +
            ninst*sizeof(int);
  if (mem_budget_ < mem + kStateCacheOverhead) {
    mem_budget_ = -1;
    return NULL;
  }
  mem_budget_ -= mem + kStateCacheOverhead;

  // Allocate new state along with room for next_ and inst_.
  char* space = new char[mem];
  State* s = new (space) State;
  (void) new (s->next_) std::atomic<State*>[nnext];
  // Work around a unfortunate bug in older versions of libstdc++.
  // (https://gcc.gnu.org/bugzilla/show_bug.cgi?id=64658)
  for (int i = 0; i < nnext; i++)
    (void) new (s->next_ + i) std::atomic<State*>(NULL);
  s->inst_ = new (s->next_ + nnext) int[ninst];
  memmove(s->inst_, inst, ninst*sizeof s->inst_[0]);
  s->ninst_ = ninst;
  s->flag_ = flag;
  if (DebugDFA)
    fprintf(stderr, " -> %s\n", DumpState(s).c_str());

  // Put state in cache and return it.
  state_cache_.insert(s);
  return s;
}